

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFilteringTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Functional::Texture2DFilteringCase::iterate(Texture2DFilteringCase *this)

{
  float *pfVar1;
  pointer pfVar2;
  TextureFormat TVar3;
  ostringstream *this_00;
  deUint32 dVar4;
  TestLog *log;
  RenderContext *context;
  TestContext *testCtx;
  pointer pFVar5;
  bool bVar6;
  int i;
  int iVar7;
  deUint32 dVar8;
  SamplerType SVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar10;
  undefined4 extraout_var_01;
  long lVar11;
  NotSupportedError *this_01;
  int i_3;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  void *data;
  pointer pFVar15;
  vector<float,_std::allocator<float>_> texCoord;
  RandomViewport viewport;
  Surface rendered;
  PixelFormat pixelFormat;
  ulong local_328 [2];
  ConstPixelBufferAccess local_318;
  Texture2DView local_2e8;
  IVec4 colorBits;
  ulong local_2c8 [3];
  ScopedLogSection section;
  LodPrecision lodPrecision;
  TextureFormat texFmt;
  ReferenceParams refParams;
  Vector<int,_4> res;
  ios_base local_188 [8];
  ios_base local_180 [272];
  TextureFormatInfo fmtInfo;
  
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar7);
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar8 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  uVar14 = ((uint)this->m_caseNdx >> 0x10 ^ this->m_caseNdx ^ 0x3d) * 9;
  uVar14 = (uVar14 >> 4 ^ uVar14) * 0x27d4eb2d;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar7),0x40,0x40,
             uVar14 >> 0xf ^ dVar8 ^ uVar14);
  texFmt = ((*(this->m_textures).
              super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
              super__Vector_impl_data._M_start)->m_refTexture).super_TextureLevelPyramid.m_format;
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  pFVar15 = (this->m_cases).
            super__Vector_base<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start + this->m_caseNdx;
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  TVar3 = (TextureFormat)(local_318.m_size.m_data + 2);
  local_318.m_format = TVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"Test","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
  std::ostream::operator<<(&res,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
  std::ios_base::~ios_base(local_188);
  uVar13 = 0xf;
  if (local_318.m_format != TVar3) {
    uVar13 = local_318._16_8_;
  }
  if (uVar13 < (ulong)((long)rendered.m_pixels.m_ptr + local_318.m_size.m_data._0_8_)) {
    uVar13 = 0xf;
    if ((size_t *)CONCAT44(rendered.m_height,rendered.m_width) != &rendered.m_pixels.m_cap) {
      uVar13 = rendered.m_pixels.m_cap;
    }
    if (uVar13 < (ulong)((long)rendered.m_pixels.m_ptr + local_318.m_size.m_data._0_8_))
    goto LAB_00f4a9b4;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&rendered,0,(char *)0x0,(ulong)local_318.m_format);
  }
  else {
LAB_00f4a9b4:
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_318,CONCAT44(rendered.m_height,rendered.m_width));
  }
  refParams.super_RenderParams._0_8_ = refParams.super_RenderParams.w.m_data + 1;
  pfVar1 = (float *)(puVar10 + 2);
  if ((float *)*puVar10 == pfVar1) {
    refParams.super_RenderParams.w.m_data._4_8_ = *(undefined8 *)pfVar1;
    refParams.super_RenderParams.w.m_data[3] = *(float *)(puVar10 + 3);
    refParams.super_RenderParams.bias = *(float *)((long)puVar10 + 0x1c);
  }
  else {
    refParams.super_RenderParams.w.m_data._4_8_ = *(undefined8 *)pfVar1;
    refParams.super_RenderParams._0_8_ = (float *)*puVar10;
  }
  refParams.super_RenderParams._8_8_ = puVar10[1];
  *puVar10 = pfVar1;
  puVar10[1] = 0;
  *(undefined1 *)pfVar1 = 0;
  pixelFormat._0_8_ = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pixelFormat,"Test ","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
  std::ostream::operator<<(&res,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
  std::ios_base::~ios_base(local_188);
  uVar13 = 0xf;
  if ((ulong *)pixelFormat._0_8_ != local_328) {
    uVar13 = local_328[0];
  }
  if (uVar13 < (ulong)(colorBits.m_data._8_8_ + pixelFormat._8_8_)) {
    uVar13 = 0xf;
    if ((ulong *)colorBits.m_data._0_8_ != local_2c8) {
      uVar13 = local_2c8[0];
    }
    if ((ulong)(colorBits.m_data._8_8_ + pixelFormat._8_8_) <= uVar13) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&colorBits,0,(char *)0x0,pixelFormat._0_8_);
      goto LAB_00f4ab0c;
    }
  }
  puVar10 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&pixelFormat,colorBits.m_data._0_8_);
LAB_00f4ab0c:
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  pfVar2 = (pointer)(puVar10 + 2);
  if ((pointer)*puVar10 == pfVar2) {
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *(pointer *)pfVar2;
  }
  else {
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *(pointer *)pfVar2;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*puVar10;
  }
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)puVar10[1];
  *puVar10 = pfVar2;
  puVar10[1] = 0;
  *(undefined1 *)pfVar2 = 0;
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&refParams,(string *)&texCoord);
  if ((pointer *)
      texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((ulong *)colorBits.m_data._0_8_ != local_2c8) {
    operator_delete((void *)colorBits.m_data._0_8_,local_2c8[0] + 1);
  }
  if ((ulong *)pixelFormat._0_8_ != local_328) {
    operator_delete((void *)pixelFormat._0_8_,local_328[0] + 1);
  }
  if ((float *)refParams.super_RenderParams._0_8_ != refParams.super_RenderParams.w.m_data + 1) {
    operator_delete((void *)refParams.super_RenderParams._0_8_,
                    refParams.super_RenderParams.w.m_data._4_8_ + 1);
  }
  if ((size_t *)CONCAT44(rendered.m_height,rendered.m_width) != &rendered.m_pixels.m_cap) {
    operator_delete((undefined1 *)CONCAT44(rendered.m_height,rendered.m_width),
                    rendered.m_pixels.m_cap + 1);
  }
  if (local_318.m_format != TVar3) {
    operator_delete((void *)local_318.m_format,local_318._16_8_ + 1);
  }
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&refParams,TEXTURETYPE_2D);
  tcu::Surface::Surface(&rendered,viewport.width,viewport.height);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((0x3f < viewport.width) && (0x3f < viewport.height)) {
    glu::mapGLSampler((Sampler *)&res,this->m_wrapS,this->m_wrapT,this->m_minFilter,
                      this->m_magFilter);
    refParams.sampler.wrapS = res.m_data[0];
    refParams.sampler.wrapT = res.m_data[1];
    refParams.sampler.wrapR = res.m_data[2];
    refParams.sampler.minFilter = res.m_data[3];
    SVar9 = glu::TextureTestUtil::getSamplerType(texFmt);
    refParams.super_RenderParams.samplerType = SVar9;
    refParams.lodMode = LODMODE_EXACT;
    refParams.super_RenderParams.colorBias.m_data[0] = fmtInfo.lookupBias.m_data[0];
    refParams.super_RenderParams.colorBias.m_data[1] = fmtInfo.lookupBias.m_data[1];
    refParams.super_RenderParams.colorBias.m_data[2] = fmtInfo.lookupBias.m_data[2];
    refParams.super_RenderParams.colorBias.m_data[3] = fmtInfo.lookupBias.m_data[3];
    refParams.super_RenderParams.colorScale.m_data[0] = fmtInfo.lookupScale.m_data[0];
    refParams.super_RenderParams.colorScale.m_data[1] = fmtInfo.lookupScale.m_data[1];
    refParams.super_RenderParams.colorScale.m_data[2] = fmtInfo.lookupScale.m_data[2];
    refParams.super_RenderParams.colorScale.m_data[3] = fmtInfo.lookupScale.m_data[3];
    res.m_data._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(res.m_data + 2);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Texture coordinates: ",0x15);
    tcu::operator<<((ostream *)this_00,&pFVar15->minCoord);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," -> ",4);
    tcu::operator<<((ostream *)this_00,&pFVar15->maxCoord);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_180);
    glu::TextureTestUtil::computeQuadTexCoord2D(&texCoord,&pFVar15->minCoord,&pFVar15->maxCoord);
    (**(code **)(lVar11 + 0xb8))(0xde1,pFVar15->texture->m_glTexture);
    (**(code **)(lVar11 + 0x1360))(0xde1,0x2801,this->m_minFilter);
    (**(code **)(lVar11 + 0x1360))(0xde1,0x2800,this->m_magFilter);
    (**(code **)(lVar11 + 0x1360))(0xde1,0x2802,this->m_wrapS);
    (**(code **)(lVar11 + 0x1360))(0xde1,0x2803,this->m_wrapT);
    (**(code **)(lVar11 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (&this->m_renderer,0,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,&refParams.super_RenderParams);
    context = this->m_renderCtx;
    local_318.m_format.order = RGBA;
    local_318.m_format.type = UNORM_INT8;
    data = (void *)rendered.m_pixels.m_cap;
    if (rendered.m_pixels.m_cap != 0) {
      data = rendered.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&res,&local_318.m_format,rendered.m_width,rendered.m_height,1,
               data);
    glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)&res);
    dVar8 = this->m_minFilter;
    dVar4 = this->m_magFilter;
    iVar7 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    pixelFormat._0_8_ = *(TextureFormat *)(CONCAT44(extraout_var_01,iVar7) + 8);
    pixelFormat._8_8_ = *(undefined8 *)(CONCAT44(extraout_var_01,iVar7) + 0x10);
    local_318.m_format = (TextureFormat)pixelFormat._0_8_;
    local_318.m_size.m_data[0] = pixelFormat.blueBits;
    local_318.m_size.m_data[1] = pixelFormat.alphaBits;
    res.m_data[0] = 0;
    res.m_data[1] = 0;
    res.m_data[2] = 0;
    res.m_data[3] = 0;
    lVar11 = 0;
    do {
      res.m_data[lVar11] =
           local_318.m_size.m_data[lVar11 + -2] +
           ((dVar4 == 0x2600 && dVar8 == 0x2600) | 0xfffffffe);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    local_2e8.m_numLevels = 0;
    local_2e8._4_4_ = 0;
    local_2e8.m_levels = (ConstPixelBufferAccess *)0x0;
    colorBits.m_data[0] = 0;
    colorBits.m_data[1] = 0;
    colorBits.m_data[2] = 0;
    colorBits.m_data[3] = 0;
    lVar11 = 0;
    do {
      iVar7 = (&local_2e8.m_numLevels)[lVar11];
      if ((&local_2e8.m_numLevels)[lVar11] < res.m_data[lVar11]) {
        iVar7 = res.m_data[lVar11];
      }
      colorBits.m_data[lVar11] = iVar7;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    lodPrecision.rule = RULE_OPENGL;
    lVar11 = 0;
    do {
      res.m_data[lVar11] = 0x16;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    lVar11 = 3;
    do {
      res.m_data[lVar11] = 0x10;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 6);
    lodPrecision.derivateBits = 7;
    lodPrecision.lodBits = 4;
    tcu::computeFixedPointThreshold((tcu *)&local_2e8,&colorBits);
    local_318.m_format.order = R;
    local_318.m_format.type = SNORM_INT8;
    local_318.m_size.m_data[0] = 0;
    local_318.m_size.m_data[1] = 0;
    lVar11 = 0;
    do {
      local_318.m_size.m_data[lVar11 + -2] =
           (int)((float)(&local_2e8.m_numLevels)[lVar11] /
                refParams.super_RenderParams.colorScale.m_data[lVar11]);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    res.m_data[0] = 9;
    res.m_data[1] = 9;
    res.m_data[2] = 0;
    res.m_data[3] = 5;
    testCtx = (this->super_TestCase).super_TestNode.m_testCtx;
    local_2e8.m_numLevels = 8;
    local_2e8._4_4_ = 3;
    if (rendered.m_pixels.m_cap != 0) {
      rendered.m_pixels.m_cap = (size_t)rendered.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_318,(TextureFormat *)&local_2e8,rendered.m_width,
               rendered.m_height,1,(void *)rendered.m_pixels.m_cap);
    local_2e8.m_levels = (pFVar15->texture->m_refTexture).m_view.m_levels;
    local_2e8.m_numLevels = (pFVar15->texture->m_refTexture).m_view.m_numLevels;
    bVar6 = glu::TextureTestUtil::verifyTextureResult
                      (testCtx,&local_318,&local_2e8,
                       texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,&refParams,(LookupPrecision *)&res,
                       &lodPrecision,&pixelFormat);
    if (!bVar6) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Image verification failed");
    }
    iVar7 = this->m_caseNdx + 1;
    this->m_caseNdx = iVar7;
    pFVar15 = (this->m_cases).
              super__Vector_base<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pFVar5 = (this->m_cases).
             super__Vector_base<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&rendered);
    tcu::TestLog::endSection(section.m_log);
    iVar12 = (int)((ulong)((long)pFVar5 - (long)pFVar15) >> 3);
    return (IterateResult)(SBORROW4(iVar7,iVar12 * -0x55555555) != iVar7 + iVar12 * 0x55555555 < 0);
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Too small viewport",glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureFilteringTests.cpp"
             ,0x113);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

Texture2DFilteringCase::IterateResult Texture2DFilteringCase::iterate (void)
{
	const glw::Functions&			gl			= m_renderCtx.getFunctions();
	const RandomViewport			viewport	(m_renderCtx.getRenderTarget(), VIEWPORT_WIDTH, VIEWPORT_HEIGHT, deStringHash(getName()) ^ deInt32Hash(m_caseNdx));
	const tcu::TextureFormat		texFmt		= m_textures[0]->getRefTexture().getFormat();
	const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
	const FilterCase&				curCase		= m_cases[m_caseNdx];
	const tcu::ScopedLogSection		section		(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	ReferenceParams					refParams	(TEXTURETYPE_2D);
	tcu::Surface					rendered	(viewport.width, viewport.height);
	vector<float>					texCoord;

	if (viewport.width < MIN_VIEWPORT_WIDTH || viewport.height < MIN_VIEWPORT_HEIGHT)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Setup params for reference.
	refParams.sampler		= mapGLSampler(m_wrapS, m_wrapT, m_minFilter, m_magFilter);
	refParams.samplerType	= getSamplerType(texFmt);
	refParams.lodMode		= LODMODE_EXACT;
	refParams.colorBias		= fmtInfo.lookupBias;
	refParams.colorScale	= fmtInfo.lookupScale;

	// Compute texture coordinates.
	m_testCtx.getLog() << TestLog::Message << "Texture coordinates: " << curCase.minCoord << " -> " << curCase.maxCoord << TestLog::EndMessage;
	computeQuadTexCoord2D(texCoord, curCase.minCoord, curCase.maxCoord);

	gl.bindTexture	(GL_TEXTURE_2D, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		m_wrapT);

	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);
	m_renderer.renderQuad(0, &texCoord[0], refParams);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, rendered.getAccess());

	{
		const bool				isNearestOnly	= m_minFilter == GL_NEAREST && m_magFilter == GL_NEAREST;
		const tcu::PixelFormat	pixelFormat		= m_renderCtx.getRenderTarget().getPixelFormat();
		const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
		tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
		tcu::LookupPrecision	lookupPrecision;

		lodPrecision.derivateBits		= 7;
		lodPrecision.lodBits			= 4;
		lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / refParams.colorScale;
		lookupPrecision.coordBits		= tcu::IVec3(9,9,0); // mediump interpolation
		lookupPrecision.uvwBits			= tcu::IVec3(5,5,0);
		lookupPrecision.colorMask		= getCompareMask(pixelFormat);

		const bool isOk = verifyTextureResult(m_testCtx, rendered.getAccess(), curCase.texture->getRefTexture(),
											  &texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

		if (!isOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}